

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O0

int av1_cost_coeffs_txb(MACROBLOCK *x,int plane,int block,TX_SIZE tx_size,TX_TYPE tx_type,
                       TXB_CTX *txb_ctx,int reduced_tx_set_used)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int16_t *piVar12;
  long lVar13;
  TX_SIZE in_CL;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  byte in_R8B;
  int *in_R9;
  undefined4 in_stack_00000008;
  TX_CLASS tx_class;
  MACROBLOCKD *xd;
  LV_MAP_COEFF_COST *coeff_costs;
  PLANE_TYPE plane_type;
  TX_SIZE txs_ctx;
  int eob;
  macroblock_plane *p;
  int ctx_2;
  int dc_sign_ctx_1;
  int sign01_1;
  int level_2;
  int sign_1;
  int coeff_ctx_2;
  tran_low_t v_2;
  int pos_3;
  int ctx_1;
  int level_1;
  tran_low_t v_1;
  int coeff_ctx_1;
  int pos_1;
  int (*base_cost) [8];
  int dc_sign_ctx;
  int sign01;
  int ctx;
  int coeff_ctx;
  int level;
  int sign;
  tran_low_t v;
  int pos;
  int c;
  int (*lps_cost) [26];
  int cost;
  LV_MAP_EOB_COST *eob_costs;
  int eob_multi_size;
  int8_t coeff_contexts [4096];
  uint8_t *levels;
  uint8_t levels_buf [1312];
  int16_t *scan;
  SCAN_ORDER *scan_order;
  int height;
  int width;
  int bhl;
  int txb_skip_ctx;
  tran_low_t *qcoeff;
  int row;
  int col;
  int mag;
  int pos_2;
  int stride;
  int row_1;
  int col_1;
  int mag_1;
  int pos_4;
  int stride_1;
  int row_2;
  int col_2;
  int local_1764;
  int local_1760;
  int local_175c;
  undefined4 in_stack_ffffffffffffe8a8;
  undefined4 in_stack_ffffffffffffe8ac;
  undefined8 in_stack_ffffffffffffe8b0;
  TX_TYPE in_stack_ffffffffffffe8ba;
  TX_SIZE in_stack_ffffffffffffe8bb;
  int in_stack_ffffffffffffe8bc;
  undefined4 in_stack_ffffffffffffe8c0;
  undefined4 in_stack_ffffffffffffe8c4;
  undefined4 in_stack_ffffffffffffe8c8;
  undefined4 in_stack_ffffffffffffe8cc;
  undefined8 in_stack_ffffffffffffe8d0;
  int local_1724;
  undefined7 in_stack_ffffffffffffe8e8;
  byte bVar14;
  undefined4 uVar15;
  undefined2 in_stack_ffffffffffffe900;
  int local_166c;
  int local_165c;
  char local_1648 [4104];
  uint8_t *local_640;
  uint8_t local_638 [1320];
  int16_t *local_110;
  SCAN_ORDER *local_108;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  tran_low_t *local_f0;
  undefined4 local_e8;
  byte local_e2;
  long local_e0;
  int16_t *local_d8;
  byte local_cd;
  uint local_cc;
  long local_c8;
  int *local_c0;
  int local_98;
  int local_94;
  byte local_8d;
  int local_8c;
  int local_88;
  undefined4 local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  byte local_69;
  int local_68;
  int local_64;
  uint8_t *local_60;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  byte local_39;
  int local_38;
  int local_34;
  uint8_t *local_30;
  int local_24;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffe8d0 >> 0x20);
  lVar11 = in_RDI + (long)in_ESI * 0x88;
  uVar3 = (uint)*(ushort *)(*(long *)(lVar11 + 0x20) + (long)in_EDX * 2);
  bVar1 = get_txsize_entropy_ctx(in_CL);
  bVar2 = get_plane_type(in_ESI);
  piVar12 = (int16_t *)(in_RDI + 0xb9d8 + (ulong)bVar1 * 0x1d80 + (ulong)bVar2 * 0xec0);
  if (uVar3 == 0) {
    return *(int *)(piVar12 + (long)*in_R9 * 4 + 2);
  }
  lVar13 = in_RDI + 0x1a0;
  bVar14 = ""[in_R8B];
  local_e8 = in_stack_00000008;
  local_f0 = (tran_low_t *)(*(long *)(lVar11 + 0x10) + (long)(in_EDX << 4) * 4);
  local_f4 = *in_R9;
  local_e2 = bVar14;
  local_e0 = lVar13;
  local_d8 = piVar12;
  local_cd = bVar2;
  local_cc = uVar3;
  local_c8 = lVar11;
  local_c0 = in_R9;
  local_f8 = get_txb_bhl('\0');
  uVar15 = (undefined4)((ulong)lVar13 >> 0x20);
  local_fc = get_txb_wide('\0');
  local_100 = get_txb_high('\0');
  local_108 = get_scan('\0','\0');
  local_110 = local_108->scan;
  local_640 = set_levels(local_638,local_100);
  iVar10 = *(int *)(local_d8 + (long)local_f4 * 4);
  (*av1_txb_init_levels)(local_f0,local_fc,local_100,local_640);
  iVar4 = get_tx_type_cost((MACROBLOCK *)
                           CONCAT44(in_stack_ffffffffffffe8cc,in_stack_ffffffffffffe8c8),
                           (MACROBLOCKD *)
                           CONCAT44(in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8c0),
                           in_stack_ffffffffffffe8bc,in_stack_ffffffffffffe8bb,
                           in_stack_ffffffffffffe8ba,(int)((ulong)in_stack_ffffffffffffe8b0 >> 0x20)
                          );
  iVar5 = get_eob_cost(iVar5,(LV_MAP_EOB_COST *)
                             CONCAT44(in_stack_ffffffffffffe8cc,in_stack_ffffffffffffe8c8),
                       (LV_MAP_COEFF_COST *)
                       CONCAT44(in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8c0),
                       (TX_CLASS)((uint)in_stack_ffffffffffffe8bc >> 0x18));
  av1_get_nz_map_contexts_sse2
            ((uint8_t *)CONCAT44(uVar3,CONCAT13(bVar1,CONCAT12(bVar2,in_stack_ffffffffffffe900))),
             piVar12,(uint16_t)((uint)uVar15 >> 0x10),(TX_SIZE)((uint)uVar15 >> 8),(TX_CLASS)uVar15,
             (int8_t *)CONCAT17(bVar14,in_stack_ffffffffffffe8e8));
  iVar6 = local_cc - 1;
  iVar7 = (int)local_110[iVar6];
  uVar3 = local_f0[iVar7];
  uVar8 = 0;
  if ((int)uVar3 < 0) {
    uVar8 = 0xffffffff;
  }
  iVar9 = (uVar3 ^ uVar8) - uVar8;
  local_1724 = iVar9;
  if (2 < iVar9) {
    local_1724 = 3;
  }
  local_165c = *(int *)(local_d8 +
                       (long)(int)local_1648[iVar7] * 6 + (long)(local_1724 + -1) * 2 + 0x34) +
               iVar5 + iVar4 + iVar10;
  if (uVar3 != 0) {
    if (2 < iVar9) {
      local_8c = local_f8;
      local_8d = local_e2;
      local_94 = iVar7 >> ((byte)local_f8 & 0x1f);
      local_98 = iVar7 - (local_94 << ((byte)local_f8 & 0x1f));
      if (iVar7 == 0) {
        local_84 = 0;
      }
      else if (((((local_e2 == 0) && (local_98 < 2)) && (local_94 < 2)) ||
               ((local_e2 == 1 && (local_94 == 0)))) || ((local_e2 == 2 && (local_98 == 0)))) {
        local_84 = 7;
      }
      else {
        local_84 = 0xe;
      }
      local_88 = iVar7;
      iVar5 = get_br_cost((tran_low_t)((ulong)in_stack_ffffffffffffe8b0 >> 0x20),
                          (int *)CONCAT44(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8));
      local_165c = iVar5 + local_165c;
    }
    if (iVar6 == 0) {
      return *(int *)(local_d8 + (long)local_c0[1] * 4 + (long)(int)-uVar8 * 2 + 0x310) + local_165c
      ;
    }
    local_165c = local_165c + 0x200;
  }
  piVar12 = local_d8;
  for (local_166c = local_cc - 2; iVar5 = local_68, local_68._0_1_ = (byte)local_f8,
      bVar1 = (byte)local_68, local_68 = iVar5, 0 < local_166c; local_166c = local_166c + -1) {
    iVar4 = (int)local_110[local_166c];
    iVar5 = local_f0[iVar4];
    iVar10 = iVar5;
    if (iVar5 < 1) {
      iVar10 = -iVar5;
    }
    iVar6 = iVar10;
    if (2 < iVar10) {
      iVar6 = 3;
    }
    local_165c = *(int *)(piVar12 + (long)(int)local_1648[iVar4] * 0x10 + (long)iVar6 * 2 + 0x4c) +
                 local_165c;
    if ((iVar5 != 0) && (local_165c = local_165c + 0x200, 2 < iVar10)) {
      local_60 = local_640;
      local_68 = local_f8;
      local_69 = local_e2;
      local_70 = iVar4 >> (bVar1 & 0x1f);
      local_74 = iVar4 - (local_70 << (bVar1 & 0x1f));
      local_78 = (1 << (bVar1 & 0x1f)) + 4;
      local_7c = local_70 * local_78 + local_74;
      local_80 = (uint)local_640[(long)local_7c + 1] + (uint)local_640[local_7c + local_78];
      if (local_e2 == 0) {
        if ((uint)((int)((uint)local_640[local_7c + local_78 + 1] + local_80 + 1) >> 1) < 6) {
          local_80 = (int)((uint)local_640[local_7c + local_78 + 1] + local_80 + 1) >> 1;
        }
        else {
          local_80 = 6;
        }
        local_54 = local_80;
        if (iVar4 != 0) {
          if ((1 < local_74) || (1 < local_70)) goto LAB_00351501;
          local_54 = local_80 + 7;
        }
      }
      else if (local_e2 == 1) {
        if ((uint)((int)((uint)local_640[local_7c + local_78 * 2] + local_80 + 1) >> 1) < 6) {
          local_80 = (int)((uint)local_640[local_7c + local_78 * 2] + local_80 + 1) >> 1;
        }
        else {
          local_80 = 6;
        }
        local_54 = local_80;
        if (iVar4 != 0) {
          if (local_70 != 0) goto LAB_00351501;
          local_54 = local_80 + 7;
        }
      }
      else if (local_e2 == 2) {
        if ((uint)((int)((uint)local_640[local_7c + 2] + local_80 + 1) >> 1) < 6) {
          local_80 = (int)((uint)local_640[local_7c + 2] + local_80 + 1) >> 1;
        }
        else {
          local_80 = 6;
        }
        local_54 = local_80;
        if (iVar4 != 0) {
          if (local_74 != 0) goto LAB_00351501;
          local_54 = local_80 + 7;
        }
      }
      else {
LAB_00351501:
        local_54 = local_80 + 0xe;
      }
      local_64 = iVar4;
      iVar5 = get_br_cost((tran_low_t)((ulong)in_stack_ffffffffffffe8b0 >> 0x20),
                          (int *)CONCAT44(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8));
      local_165c = iVar5 + local_165c;
    }
  }
  local_34 = (int)local_110[local_166c];
  uVar3 = local_f0[local_34];
  uVar8 = 0;
  if ((int)uVar3 < 0) {
    uVar8 = 0xffffffff;
  }
  iVar10 = (uVar3 ^ uVar8) - uVar8;
  piVar12 = piVar12 + (long)(int)local_1648[local_34] * 0x10 + 0x4c;
  iVar5 = iVar10;
  if (2 < iVar10) {
    iVar5 = 3;
  }
  local_165c = *(int *)(piVar12 + (long)iVar5 * 2) + local_165c;
  if (uVar3 == 0) {
    return local_165c;
  }
  local_165c = *(int *)(local_d8 + (long)local_c0[1] * 4 + (long)(int)-uVar8 * 2 + 0x310) +
               local_165c;
  if (iVar10 < 3) {
    return local_165c;
  }
  local_30 = local_640;
  local_38 = local_f8;
  local_39 = local_e2;
  local_40 = local_34 >> ((byte)local_68 & 0x1f);
  local_44 = local_34 - (local_40 << ((byte)local_68 & 0x1f));
  local_48 = (1 << ((byte)local_68 & 0x1f)) + 4;
  local_4c = local_40 * local_48 + local_44;
  local_50 = (uint)local_640[(long)local_4c + 1] + (uint)local_640[local_4c + local_48];
  uVar3 = (uint)local_e2;
  if (uVar3 == 0) {
    if ((uint)((int)((uint)local_640[local_4c + local_48 + 1] + local_50 + 1) >> 1) < 6) {
      local_175c = (int)((uint)local_640[local_4c + local_48 + 1] + local_50 + 1) >> 1;
    }
    else {
      local_175c = 6;
    }
    local_50 = local_175c;
    if (local_34 == 0) {
      local_24 = local_175c;
      goto LAB_003519fa;
    }
    if ((local_44 < 2) && (local_40 < 2)) {
      local_24 = local_175c + 7;
      goto LAB_003519fa;
    }
  }
  else if (uVar3 == 1) {
    if ((uint)((int)((uint)local_640[local_4c + local_48 * 2] + local_50 + 1) >> 1) < 6) {
      local_1760 = (int)((uint)local_640[local_4c + local_48 * 2] + local_50 + 1) >> 1;
    }
    else {
      local_1760 = 6;
    }
    local_50 = local_1760;
    if (local_34 == 0) {
      local_24 = local_1760;
      goto LAB_003519fa;
    }
    if (local_40 == 0) {
      local_24 = local_1760 + 7;
      goto LAB_003519fa;
    }
  }
  else if (uVar3 == 2) {
    if ((uint)((int)((uint)local_640[local_4c + 2] + local_50 + 1) >> 1) < 6) {
      local_1764 = (int)((uint)local_640[local_4c + 2] + local_50 + 1) >> 1;
    }
    else {
      local_1764 = 6;
    }
    local_50 = local_1764;
    if (local_34 == 0) {
      local_24 = local_1764;
      goto LAB_003519fa;
    }
    if (local_44 == 0) {
      local_24 = local_1764 + 7;
      goto LAB_003519fa;
    }
  }
  local_24 = local_50 + 0xe;
LAB_003519fa:
  iVar5 = get_br_cost((tran_low_t)((ulong)piVar12 >> 0x20),(int *)CONCAT44(iVar5,uVar3));
  return iVar5 + local_165c;
}

Assistant:

int av1_cost_coeffs_txb(const MACROBLOCK *x, const int plane, const int block,
                        const TX_SIZE tx_size, const TX_TYPE tx_type,
                        const TXB_CTX *const txb_ctx, int reduced_tx_set_used) {
  const struct macroblock_plane *p = &x->plane[plane];
  const int eob = p->eobs[block];
  const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
  const PLANE_TYPE plane_type = get_plane_type(plane);
  const LV_MAP_COEFF_COST *const coeff_costs =
      &x->coeff_costs.coeff_costs[txs_ctx][plane_type];
  if (eob == 0) {
    return coeff_costs->txb_skip_cost[txb_ctx->txb_skip_ctx][1];
  }

  const MACROBLOCKD *const xd = &x->e_mbd;
  const TX_CLASS tx_class = tx_type_to_class[tx_type];

  return warehouse_efficients_txb(x, plane, block, tx_size, txb_ctx, p, eob,
                                  plane_type, coeff_costs, xd, tx_type,
                                  tx_class, reduced_tx_set_used);
}